

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mshinfo.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *MshIdx;
  size_t sVar3;
  int64_t iVar4;
  ulong uVar5;
  long in_RSI;
  int in_EDI;
  int ln;
  char *subsol;
  char *sub;
  char sol [1024];
  char name [1024];
  int TypTab [1000];
  int NbrTyp;
  int SolSiz;
  int NbrLin;
  double time;
  double dbl;
  float flt;
  int ite;
  int j;
  int i;
  int64_t InpSol;
  int64_t InpMsh;
  int OrdEdgP4;
  int OrdQuaQ4;
  int OrdTriP4;
  int OrdPyrP4;
  int OrdPriP4;
  int OrdHexQ4;
  int OrdTetP4;
  int OrdEdgP3;
  int OrdQuaQ3;
  int OrdTriP3;
  int OrdPyrP3;
  int OrdPriP3;
  int OrdHexQ3;
  int OrdTetP3;
  int OrdEdgP2;
  int OrdQuaQ2;
  int OrdTriP2;
  int OrdPyrP2;
  int OrdPriP2;
  int OrdHexQ2;
  int OrdTetP2;
  int OrdEdg;
  int OrdQua;
  int OrdTri;
  int OrdPyr;
  int OrdPri;
  int OrdHex;
  int OrdTet;
  int NmbEdgP4;
  int NmbQuaQ4;
  int NmbTriP4;
  int NmbPyrP4;
  int NmbPriP4;
  int NmbHexQ4;
  int NmbTetP4;
  int NmbEdgP3;
  int NmbQuaQ3;
  int NmbTriP3;
  int NmbPyrP3;
  int NmbPriP3;
  int NmbHexQ3;
  int NmbTetP3;
  int NmbNod;
  int NmbEdgP2;
  int NmbQuaQ2;
  int NmbTriP2;
  int NmbPyrP2;
  int NmbPriP2;
  int NmbHexQ2;
  int NmbTetP2;
  int NmbEdg;
  int NmbQua;
  int NmbTri;
  int NmbPyr;
  int NmbPri;
  int NmbHex;
  int NmbTet;
  int NmbRidg;
  int NmbCor;
  int FilVer;
  int deg;
  int dim;
  int NmbVer;
  undefined4 in_stack_ffffffffffffe6f0;
  int in_stack_ffffffffffffe6f4;
  char local_18f8 [348];
  char local_14f8 [332];
  int local_10f8 [1003];
  int local_14c;
  undefined1 local_148 [4];
  int local_144;
  double local_140;
  double local_138;
  float local_130;
  uint local_12c;
  int local_128;
  uint local_124;
  int64_t local_120;
  long local_118;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  long local_10;
  undefined4 local_4;
  
  local_4 = 0;
  local_118 = 0;
  local_120 = 0;
  local_12c = 0;
  local_140 = 0.0;
  local_1c = 1;
  local_64 = 0;
  if (in_EDI < 2) {
    printf(" USAGE : mshinfo name [-check]\n");
    exit(1);
  }
  local_10 = in_RSI;
  strcpy(local_14f8,*(char **)(in_RSI + 8));
  strcpy(local_18f8,*(char **)(local_10 + 8));
  pcVar2 = strstr(local_14f8,".mesh");
  MshIdx = strstr(local_14f8,".sol");
  if (MshIdx == (char *)0x0) {
    if (pcVar2 == (char *)0x0) {
      strcat(local_14f8,".meshb");
      local_118 = GmfOpenMesh(local_14f8,1,&local_20,&local_18);
      if (local_118 == 0) {
        sVar3 = strlen(local_14f8);
        in_stack_ffffffffffffe6f4 = (int)sVar3;
        local_14f8[in_stack_ffffffffffffe6f4 + -1] = '\0';
        local_118 = GmfOpenMesh(local_14f8,1,&local_20,&local_18);
      }
    }
    else {
      pcVar2[-0x400] = '\0';
      local_118 = GmfOpenMesh(local_14f8,1,&local_20,&local_18);
    }
  }
  if ((local_118 != 0) && (MshIdx == (char *)0x0)) {
    printf("Mesh informations :\n");
    iVar4 = GmfStatKwd(local_118,4);
    local_14 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0xd);
    local_24 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0xe);
    local_28 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,8);
    local_2c = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,10);
    local_30 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x31);
    local_38 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,9);
    local_34 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,6);
    local_3c = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,7);
    local_40 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,5);
    local_44 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x1e);
    local_48 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x21);
    local_4c = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x57);
    local_54 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x56);
    local_50 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x18);
    local_58 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x1b);
    local_5c = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x19);
    local_60 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x60);
    local_68 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x62);
    local_6c = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,100);
    local_74 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x66);
    local_70 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x5a);
    local_78 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x58);
    local_7c = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x5c);
    local_80 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x61);
    local_84 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,99);
    local_88 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x65);
    local_90 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x67);
    local_8c = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x5b);
    local_94 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x59);
    local_98 = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x5d);
    local_9c = (uint)iVar4;
    iVar4 = GmfStatKwd(local_118,0x93);
    local_a0 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x99);
    local_a4 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x95);
    local_ac = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x97);
    local_a8 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x8f);
    local_b0 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x91);
    local_b4 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x8d);
    local_b8 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x85);
    local_bc = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x8b);
    local_c0 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x87);
    local_c8 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x89);
    local_c4 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x81);
    local_cc = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x83);
    local_d0 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x7f);
    local_d4 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x86);
    local_d8 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x8c);
    local_dc = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x88);
    local_e4 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x8a);
    local_e0 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x82);
    local_e8 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x84);
    local_ec = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x80);
    local_f0 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x94);
    local_f4 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x9a);
    local_f8 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x96);
    local_100 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x98);
    local_fc = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x90);
    local_104 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x92);
    local_108 = (int)iVar4;
    iVar4 = GmfStatKwd(local_118,0x8e);
    local_10c = (int)iVar4;
    printf("version = %d; dim = %d; nbv = %d; (nbc = %d)\n",(ulong)local_20,(ulong)local_18,
           (ulong)local_14,(ulong)local_24);
    if ((0 < (int)local_2c) ||
       (((((0 < (int)local_3c || (0 < (int)local_44)) || (0 < (int)local_30)) ||
         ((0 < (int)local_34 || (0 < (int)local_38)))) || (0 < (int)local_40)))) {
      printf("P1/Q1 elements :\n");
      if (((0 < (int)local_2c) || (0 < (int)local_3c)) || (0 < (int)local_44)) {
        printf("nbtet = %d; nbtri = %d; nbedg = %d; (nbrdg = %d)\n",(ulong)local_2c,(ulong)local_3c,
               (ulong)local_44,(ulong)local_28);
      }
      if ((((0 < (int)local_30) || (0 < (int)local_34)) || (0 < (int)local_38)) ||
         (0 < (int)local_40)) {
        printf("nbhex = %d; nbpri = %d; nbpyr = %d; nbqua = %d\n",(ulong)local_30,(ulong)local_34,
               (ulong)local_38,(ulong)local_40);
      }
    }
    if (((0 < local_a0) || (0 < local_b0)) ||
       ((((0 < local_b8 || ((0 < local_a4 || (0 < local_a8)))) || (0 < local_ac)) || (0 < local_b4))
       )) {
      printf("P1/Q1 ordering :\n");
      if (((0 < local_a0) || (0 < local_b0)) || (0 < local_b8)) {
        if (0 < local_a0) {
          printf("tet ");
        }
        if (0 < local_b0) {
          printf("tri ");
        }
        if (0 < local_b8) {
          printf("edg ");
        }
        printf("\n");
      }
      if (((0 < local_a4) || (0 < local_a8)) || ((0 < local_ac || (0 < local_b4)))) {
        if (0 < local_a4) {
          printf("hex ");
        }
        if (0 < local_a8) {
          printf("pri ");
        }
        if (0 < local_ac) {
          printf("pyr ");
        }
        if (0 < local_b4) {
          printf("qua ");
        }
        printf("\n");
      }
    }
    if (((0 < (int)local_48) || (0 < (int)local_58)) ||
       ((0 < (int)local_60 ||
        ((((0 < (int)local_4c || (0 < (int)local_50)) || (0 < (int)local_54)) || (0 < (int)local_5c)
         ))))) {
      printf("P2/Q2 elements :\n");
      if (((0 < (int)local_48) || (0 < (int)local_58)) || (0 < (int)local_60)) {
        printf("nbtetP2 = %d; nbtriP2 = %d; nbedgP2 = %d; (nbrdg = %d)\n",(ulong)local_48,
               (ulong)local_58,(ulong)local_60,(ulong)local_28);
      }
      if (((0 < (int)local_4c) || (0 < (int)local_50)) ||
         ((0 < (int)local_54 || (0 < (int)local_5c)))) {
        printf("nbhexQ2 = %d; nbpriP2 = %d; nbpyrP2 = %d; nbquaQ2 = %d\n",(ulong)local_4c,
               (ulong)local_50,(ulong)local_54,(ulong)local_5c);
      }
    }
    if (((((0 < local_bc) || (0 < local_cc)) || (0 < local_d4)) ||
        ((0 < local_c0 || (0 < local_c4)))) || ((0 < local_c8 || (0 < local_d0)))) {
      printf("P2/Q2 ordering :\n");
      if (((0 < local_bc) || (0 < local_cc)) || (0 < local_d4)) {
        if (0 < local_bc) {
          printf("tetP2 ");
        }
        if (0 < local_cc) {
          printf("triP2 ");
        }
        if (0 < local_d4) {
          printf("edgP2 ");
        }
        printf("\n");
      }
      if ((((0 < local_c0) || (0 < local_c4)) || (0 < local_c8)) || (0 < local_d0)) {
        if (0 < local_c0) {
          printf("hexQ2 ");
        }
        if (0 < local_c4) {
          printf("priP2 ");
        }
        if (0 < local_c8) {
          printf("pyrP2 ");
        }
        if (0 < local_d0) {
          printf("quaQ2 ");
        }
        printf("\n");
      }
    }
    if (((0 < (int)local_68) || (0 < (int)local_78)) ||
       ((((0 < (int)local_80 || ((0 < (int)local_6c || (0 < (int)local_70)))) || (0 < (int)local_74)
         ) || (0 < (int)local_7c)))) {
      printf("P3/Q3 elements :\n");
      if (((0 < (int)local_68) || (0 < (int)local_78)) || (0 < (int)local_80)) {
        printf("nbtetP3 = %d; nbtriP3 = %d; nbedgP3 = %d; (nbrdg = %d)\n",(ulong)local_68,
               (ulong)local_78,(ulong)local_80,(ulong)local_28);
      }
      if (((0 < (int)local_6c) || (0 < (int)local_70)) ||
         ((0 < (int)local_74 || (0 < (int)local_7c)))) {
        printf("nbhexQ3 = %d; nbpriP3 = %d; nbpyrP3 = %d; nbquaQ3 = %d\n",(ulong)local_6c,
               (ulong)local_70,(ulong)local_74,(ulong)local_7c);
      }
    }
    if (((0 < local_d8) || (0 < local_e8)) ||
       ((0 < local_f0 || ((((0 < local_dc || (0 < local_e0)) || (0 < local_e4)) || (0 < local_ec))))
       )) {
      printf("P3/Q3 ordering :\n");
      if (((0 < local_d8) || (0 < local_e8)) || (0 < local_f0)) {
        if (0 < local_d8) {
          printf("tetP3 ");
        }
        if (0 < local_e8) {
          printf("triP3 ");
        }
        if (0 < local_f0) {
          printf("edgP3 ");
        }
        printf("\n");
      }
      if (((0 < local_dc) || (0 < local_e0)) || ((0 < local_e4 || (0 < local_ec)))) {
        if (0 < local_dc) {
          printf("hexQ3 ");
        }
        if (0 < local_e0) {
          printf("priP3 ");
        }
        if (0 < local_e4) {
          printf("pyrP3 ");
        }
        if (0 < local_ec) {
          printf("quaQ3 ");
        }
        printf("\n");
      }
    }
    if ((((0 < (int)local_84) || (0 < (int)local_94)) || (0 < (int)local_9c)) ||
       (((0 < (int)local_88 || (0 < (int)local_8c)) || ((0 < (int)local_90 || (0 < (int)local_98))))
       )) {
      printf("P4/Q4 elements :\n");
      if (((0 < (int)local_84) || (0 < (int)local_94)) || (0 < (int)local_9c)) {
        printf("nbtetP4 = %d; nbtriP4 = %d; nbedgP4 = %d; (nbrdg = %d)\n",(ulong)local_84,
               (ulong)local_94,(ulong)local_9c,(ulong)local_28);
      }
      if ((((0 < (int)local_88) || (0 < (int)local_8c)) || (0 < (int)local_90)) ||
         (0 < (int)local_98)) {
        printf("nbhexQ4 = %d; nbpriP4 = %d; nbpyrP4 = %d; nbquaQ4 = %d\n",(ulong)local_88,
               (ulong)local_8c,(ulong)local_90,(ulong)local_98);
      }
    }
    if (((0 < local_f4) || (0 < local_104)) ||
       ((((0 < local_10c || ((0 < local_f8 || (0 < local_fc)))) || (0 < local_100)) ||
        (0 < local_108)))) {
      printf("P4/Q4 ordering :\n");
      if (((0 < local_f4) || (0 < local_104)) || (0 < local_10c)) {
        if (0 < local_f4) {
          printf("tetP4 ");
        }
        if (0 < local_104) {
          printf("triP4 ");
        }
        if (0 < local_10c) {
          printf("edgP4 ");
        }
        printf("\n");
      }
      if (((0 < local_f8) || (0 < local_fc)) || ((0 < local_100 || (0 < local_108)))) {
        if (0 < local_f8) {
          printf("hexQ4 ");
        }
        if (0 < local_fc) {
          printf("priP4 ");
        }
        if (0 < local_100) {
          printf("pyrP4 ");
        }
        if (0 < local_108) {
          printf("quaQ4 ");
        }
        printf("\n");
      }
    }
    GmfCloseMesh(CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
  }
  if (MshIdx == (char *)0x0) {
    strcat(local_18f8,".sol");
    local_120 = GmfOpenMesh(local_18f8,1,&local_20,&local_18);
    if (local_120 == 0) {
      strcat(local_18f8,"b");
      local_120 = GmfOpenMesh(local_18f8,1,&local_20,&local_18);
    }
  }
  else {
    local_120 = GmfOpenMesh(local_18f8,1,&local_20,&local_18);
    if (local_120 == 0) {
      strcat(local_18f8,"b");
      local_120 = GmfOpenMesh(local_18f8,1,&local_20,&local_18);
    }
  }
  if (local_120 != 0) {
    printf("Solution informations :\n");
    iVar4 = GmfStatKwd(local_120,0x4e);
    if (iVar4 != 0) {
      GmfGotoKwd((int64_t)MshIdx,in_stack_ffffffffffffe6f4);
      if (local_20 == 8) {
        GmfGetLin(local_120,0x4e,&local_130);
        local_140 = (double)local_130;
      }
      else if (local_20 == 9) {
        GmfGetLin(local_120,0x4e,&local_138);
        local_140 = local_138;
      }
    }
    iVar4 = GmfStatKwd(local_120,0x4d);
    if (iVar4 != 0) {
      GmfGotoKwd((int64_t)MshIdx,in_stack_ffffffffffffe6f4);
      GmfGetLin(local_120,0x4d,&local_12c);
    }
    printf("dim = %d; ite = %d; time = %lg\n",local_140,(ulong)local_18,(ulong)local_12c);
    for (local_124 = 1; (int)local_124 < 0xf1; local_124 = local_124 + 1) {
      iVar1 = strcmp(GmfKwdFmt[(int)local_124][2],"sr");
      if ((iVar1 == 0) || (iVar1 = strcmp(GmfKwdFmt[(int)local_124][2],"hr"), iVar1 == 0)) {
        uVar5 = GmfStatKwd(local_120,(int)(ulong)local_124,&local_14c,local_148,local_10f8,&local_1c
                           ,&local_64);
        local_144 = (int)uVar5;
        if (local_144 != 0) {
          printf("%s = %d\n",GmfKwdFmt[(int)local_124][0],uVar5 & 0xffffffff);
          if ((local_1c != 1) && (local_64 != 0)) {
            printf("deg = %d; nbnod = %d\n",(ulong)local_1c,(ulong)local_64);
          }
          printf("type = [");
          for (local_128 = 0; local_128 < local_14c; local_128 = local_128 + 1) {
            if (local_10f8[local_128] == 1) {
              printf(" scalar ");
            }
            else if (local_10f8[local_128] == 2) {
              printf(" vector ");
            }
            else if (local_10f8[local_128] == 3) {
              printf(" metric ");
            }
            else if (local_10f8[local_128] == 4) {
              printf(" matrix ");
            }
          }
          printf("]\n");
          local_1c = 1;
          local_64 = 0;
        }
      }
    }
    GmfCloseMesh(CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
  }
  if ((local_120 == 0) && (local_118 == 0)) {
    printf("cannot open mesh/solution file %s\n",*(undefined8 *)(local_10 + 8));
    exit(1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  int        NmbVer, dim, deg, FilVer, NmbCor, NmbRidg;
  int        NmbTet, NmbHex, NmbPri, NmbPyr, NmbTri, NmbQua, NmbEdg;
  int        NmbTetP2, NmbHexQ2, NmbPriP2, NmbPyrP2, NmbTriP2, NmbQuaQ2, NmbEdgP2, NmbNod;
  int        NmbTetP3, NmbHexQ3, NmbPriP3, NmbPyrP3, NmbTriP3, NmbQuaQ3, NmbEdgP3;
  int        NmbTetP4, NmbHexQ4, NmbPriP4, NmbPyrP4, NmbTriP4, NmbQuaQ4, NmbEdgP4;
  int        OrdTet, OrdHex, OrdPri, OrdPyr, OrdTri, OrdQua, OrdEdg;
  int        OrdTetP2, OrdHexQ2, OrdPriP2, OrdPyrP2, OrdTriP2, OrdQuaQ2, OrdEdgP2;
  int        OrdTetP3, OrdHexQ3, OrdPriP3, OrdPyrP3, OrdTriP3, OrdQuaQ3, OrdEdgP3;
  int        OrdTetP4, OrdHexQ4, OrdPriP4, OrdPyrP4, OrdTriP4, OrdQuaQ4, OrdEdgP4;
  int64_t    InpMsh = 0, InpSol = 0;
  int        i, j, ite = 0;
  float      flt;
  double     dbl, time = 0.0;
  int        NbrLin, SolSiz, NbrTyp, TypTab[ GmfMaxTyp ];
  

  deg    = 1;
  NmbNod = 0;


  if (argc <= 1) {
    printf(" USAGE : mshinfo name [-check]\n");
    exit(1);
  }

  char name[1024];
  char sol[1024];

  strcpy(name,argv[1]);
  strcpy(sol,argv[1]);


  char *sub = NULL;
  sub = strstr(name,".mesh"); // check if it has the extension .mesh[b]


  char *subsol = NULL;
  subsol = strstr(name,".sol"); // check if it has the extension .sol[b]

// Mesh part

//-- test the reading of the file as a mesh
  if (subsol == NULL) { //--- no extension sol[b], check if it is a mesh name without extnsion
    if(sub != NULL) sol[sub-name]='\0'; // change file name to be opened as sol even if mesh extension is given

    if (sub != NULL)
      InpMsh = GmfOpenMesh(name, GmfRead, &FilVer, &dim);
    else {
      strcat(name,".meshb");
      InpMsh = GmfOpenMesh(name, GmfRead, &FilVer, &dim);
      if(InpMsh == 0){
        int ln = strlen(name);
        name[ln -1] = '\0';
        InpMsh = GmfOpenMesh(name, GmfRead, &FilVer, &dim);
      }
    }
  }

  if ( InpMsh != 0 && subsol == NULL ) {
    printf("Mesh informations :\n");
   /* Get number of entities*/
       
    NmbVer   = GmfStatKwd(InpMsh, GmfVertices);
    NmbCor   = GmfStatKwd(InpMsh, GmfCorners);
    NmbRidg  = GmfStatKwd(InpMsh, GmfRidges);
    NmbTet   = GmfStatKwd(InpMsh, GmfTetrahedra);
    NmbHex   = GmfStatKwd(InpMsh, GmfHexahedra);
    NmbPyr   = GmfStatKwd(InpMsh, GmfPyramids);
    NmbPri   = GmfStatKwd(InpMsh, GmfPrisms);
    NmbTri   = GmfStatKwd(InpMsh, GmfTriangles);
    NmbQua   = GmfStatKwd(InpMsh, GmfQuadrilaterals);
    NmbEdg   = GmfStatKwd(InpMsh, GmfEdges);
    NmbTetP2 = GmfStatKwd(InpMsh, GmfTetrahedraP2);
    NmbHexQ2 = GmfStatKwd(InpMsh, GmfHexahedraQ2);
    NmbPyrP2 = GmfStatKwd(InpMsh, GmfPyramidsP2);
    NmbPriP2 = GmfStatKwd(InpMsh, GmfPrismsP2);
    NmbTriP2 = GmfStatKwd(InpMsh, GmfTrianglesP2);
    NmbQuaQ2 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ2);
    NmbEdgP2 = GmfStatKwd(InpMsh, GmfEdgesP2);
    NmbTetP3 = GmfStatKwd(InpMsh, GmfTetrahedraP3);
    NmbHexQ3 = GmfStatKwd(InpMsh, GmfHexahedraQ3);
    NmbPyrP3 = GmfStatKwd(InpMsh, GmfPyramidsP3);
    NmbPriP3 = GmfStatKwd(InpMsh, GmfPrismsP3);
    NmbTriP3 = GmfStatKwd(InpMsh, GmfTrianglesP3);
    NmbQuaQ3 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ3);
    NmbEdgP3 = GmfStatKwd(InpMsh, GmfEdgesP3);
    NmbTetP4 = GmfStatKwd(InpMsh, GmfTetrahedraP4);
    NmbHexQ4 = GmfStatKwd(InpMsh, GmfHexahedraQ4);
    NmbPyrP4 = GmfStatKwd(InpMsh, GmfPyramidsP4);
    NmbPriP4 = GmfStatKwd(InpMsh, GmfPrismsP4);
    NmbTriP4 = GmfStatKwd(InpMsh, GmfTrianglesP4);
    NmbQuaQ4 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ4);
    NmbEdgP4 = GmfStatKwd(InpMsh, GmfEdgesP4);

    //-- Nodes ordering
    OrdTet   = GmfStatKwd(InpMsh, GmfTetrahedraP1Ordering);
    OrdHex   = GmfStatKwd(InpMsh, GmfHexahedraQ1Ordering);
    OrdPyr   = GmfStatKwd(InpMsh, GmfPyramidsP1Ordering);
    OrdPri   = GmfStatKwd(InpMsh, GmfPrismsP1Ordering);
    OrdTri   = GmfStatKwd(InpMsh, GmfTrianglesP1Ordering);
    OrdQua   = GmfStatKwd(InpMsh, GmfQuadrilateralsQ1Ordering);
    OrdEdg   = GmfStatKwd(InpMsh, GmfEdgesP1Ordering);
    OrdTetP2 = GmfStatKwd(InpMsh, GmfTetrahedraP2Ordering);
    OrdHexQ2 = GmfStatKwd(InpMsh, GmfHexahedraQ2Ordering);
    OrdPyrP2 = GmfStatKwd(InpMsh, GmfPyramidsP2Ordering);
    OrdPriP2 = GmfStatKwd(InpMsh, GmfPrismsP2Ordering);
    OrdTriP2 = GmfStatKwd(InpMsh, GmfTrianglesP2Ordering);
    OrdQuaQ2 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ2Ordering);
    OrdEdgP2 = GmfStatKwd(InpMsh, GmfEdgesP2Ordering);
    OrdTetP3 = GmfStatKwd(InpMsh, GmfTetrahedraP3Ordering);
    OrdHexQ3 = GmfStatKwd(InpMsh, GmfHexahedraQ3Ordering);
    OrdPyrP3 = GmfStatKwd(InpMsh, GmfPyramidsP3Ordering);
    OrdPriP3 = GmfStatKwd(InpMsh, GmfPrismsP3Ordering);
    OrdTriP3 = GmfStatKwd(InpMsh, GmfTrianglesP3Ordering);
    OrdQuaQ3 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ3Ordering);
    OrdEdgP3 = GmfStatKwd(InpMsh, GmfEdgesP3Ordering);
    OrdTetP4 = GmfStatKwd(InpMsh, GmfTetrahedraP4Ordering);
    OrdHexQ4 = GmfStatKwd(InpMsh, GmfHexahedraQ4Ordering);
    OrdPyrP4 = GmfStatKwd(InpMsh, GmfPyramidsP4Ordering);
    OrdPriP4 = GmfStatKwd(InpMsh, GmfPrismsP4Ordering);
    OrdTriP4 = GmfStatKwd(InpMsh, GmfTrianglesP4Ordering);
    OrdQuaQ4 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ4Ordering);
    OrdEdgP4 = GmfStatKwd(InpMsh, GmfEdgesP4Ordering);
 
    printf("version = %d; dim = %d; nbv = %d; (nbc = %d)\n", FilVer, dim, NmbVer, NmbCor);
    
    if ( NmbTet > 0 || NmbTri > 0 || NmbEdg > 0 || NmbHex > 0|| NmbPri > 0 || NmbPyr > 0|| NmbQua > 0 ) {
      printf("P1/Q1 elements :\n");
      if ( NmbTet >0 || NmbTri > 0 || NmbEdg > 0 ) 
        printf("nbtet = %d; nbtri = %d; nbedg = %d; (nbrdg = %d)\n", NmbTet, NmbTri, NmbEdg, NmbRidg);
      if ( NmbHex > 0|| NmbPri > 0 || NmbPyr > 0|| NmbQua > 0 )
        printf("nbhex = %d; nbpri = %d; nbpyr = %d; nbqua = %d\n", NmbHex, NmbPri, NmbPyr, NmbQua);
    }
    
    if ( OrdTet >0 || OrdTri > 0 || OrdEdg > 0 || OrdHex > 0|| OrdPri > 0 || OrdPyr > 0|| OrdQua > 0 ) {
      printf("P1/Q1 ordering :\n");
      if ( OrdTet > 0 || OrdTri > 0 || OrdEdg > 0 ) {
        if ( OrdTet > 0 )
          printf("tet ");
        if ( OrdTri > 0 )
          printf("tri ");
        if ( OrdEdg > 0 )
          printf("edg ");
        printf("\n");
      }
      if ( OrdHex > 0|| OrdPri > 0 || OrdPyr > 0|| OrdQua > 0 ) {
        if ( OrdHex > 0 )
          printf("hex ");
        if ( OrdPri > 0 )
          printf("pri ");
        if ( OrdPyr > 0 )
          printf("pyr ");
        if ( OrdQua > 0 )
          printf("qua ");
        printf("\n");
      }
    }

    if ( NmbTetP2 > 0 || NmbTriP2 > 0 || NmbEdgP2 > 0 || NmbHexQ2 > 0|| NmbPriP2 > 0 || NmbPyrP2 > 0|| NmbQuaQ2 > 0 ) {
      printf("P2/Q2 elements :\n"); 
      if ( NmbTetP2 > 0 || NmbTriP2 > 0 || NmbEdgP2 > 0 )
        printf("nbtetP2 = %d; nbtriP2 = %d; nbedgP2 = %d; (nbrdg = %d)\n", NmbTetP2, NmbTriP2, NmbEdgP2, NmbRidg);
      if ( NmbHexQ2 > 0|| NmbPriP2 > 0 || NmbPyrP2 > 0|| NmbQuaQ2 > 0 )
        printf("nbhexQ2 = %d; nbpriP2 = %d; nbpyrP2 = %d; nbquaQ2 = %d\n", NmbHexQ2, NmbPriP2, NmbPyrP2, NmbQuaQ2);
    }
    
    if ( OrdTetP2 >0 || OrdTriP2 > 0 || OrdEdgP2 > 0 || OrdHexQ2 > 0|| OrdPriP2 > 0 || OrdPyrP2 > 0|| OrdQuaQ2 > 0 ) {
      printf("P2/Q2 ordering :\n");
      if ( OrdTetP2 > 0 || OrdTriP2 > 0 || OrdEdgP2 > 0 ) {
        if ( OrdTetP2 > 0 )
          printf("tetP2 ");
        if ( OrdTriP2 > 0 )
          printf("triP2 ");
        if ( OrdEdgP2 > 0 )
          printf("edgP2 ");
        printf("\n");
      }
      if ( OrdHexQ2 > 0|| OrdPriP2 > 0 || OrdPyrP2 > 0|| OrdQuaQ2 > 0 ) {
        if ( OrdHexQ2 > 0 )
          printf("hexQ2 ");
        if ( OrdPriP2 > 0 )
          printf("priP2 ");
        if ( OrdPyrP2 > 0 )
          printf("pyrP2 ");
        if ( OrdQuaQ2 > 0 )
          printf("quaQ2 ");
        printf("\n");
      }
    }

    if ( NmbTetP3 > 0 || NmbTriP3 > 0 || NmbEdgP3 > 0 || NmbHexQ3 > 0|| NmbPriP3 > 0 || NmbPyrP3 > 0|| NmbQuaQ3 > 0 ) {
      printf("P3/Q3 elements :\n"); 
      if ( NmbTetP3 > 0 || NmbTriP3 > 0 || NmbEdgP3 > 0 )
        printf("nbtetP3 = %d; nbtriP3 = %d; nbedgP3 = %d; (nbrdg = %d)\n", NmbTetP3, NmbTriP3, NmbEdgP3, NmbRidg);
      if ( NmbHexQ3 > 0|| NmbPriP3 > 0 || NmbPyrP3 > 0|| NmbQuaQ3 > 0 )
        printf("nbhexQ3 = %d; nbpriP3 = %d; nbpyrP3 = %d; nbquaQ3 = %d\n", NmbHexQ3, NmbPriP3, NmbPyrP3, NmbQuaQ3);
    }

    if ( OrdTetP3 >0 || OrdTriP3 > 0 || OrdEdgP3 > 0 || OrdHexQ3 > 0|| OrdPriP3 > 0 || OrdPyrP3 > 0|| OrdQuaQ3 > 0 ) {
      printf("P3/Q3 ordering :\n");
      if ( OrdTetP3 > 0 || OrdTriP3 > 0 || OrdEdgP3 > 0 ) {
        if ( OrdTetP3 > 0 )
          printf("tetP3 ");
        if ( OrdTriP3 > 0 )
          printf("triP3 ");
        if ( OrdEdgP3 > 0 )
          printf("edgP3 ");
        printf("\n");
      }
      if ( OrdHexQ3 > 0|| OrdPriP3 > 0 || OrdPyrP3 > 0|| OrdQuaQ3 > 0 ) {
        if ( OrdHexQ3 > 0 )
          printf("hexQ3 ");
        if ( OrdPriP3 > 0 )
          printf("priP3 ");
        if ( OrdPyrP3 > 0 )
          printf("pyrP3 ");
        if ( OrdQuaQ3 > 0 )
          printf("quaQ3 ");
        printf("\n");
      }
    }

    if ( NmbTetP4 > 0 || NmbTriP4 > 0 || NmbEdgP4 > 0 || NmbHexQ4 > 0|| NmbPriP4 > 0 || NmbPyrP4 > 0|| NmbQuaQ4 > 0 ) {
      printf("P4/Q4 elements :\n"); 
      if ( NmbTetP4 > 0 || NmbTriP4 > 0 || NmbEdgP4 > 0 )
        printf("nbtetP4 = %d; nbtriP4 = %d; nbedgP4 = %d; (nbrdg = %d)\n", NmbTetP4, NmbTriP4, NmbEdgP4, NmbRidg);
      if ( NmbHexQ4 > 0|| NmbPriP4 > 0 || NmbPyrP4 > 0|| NmbQuaQ4 > 0 )
        printf("nbhexQ4 = %d; nbpriP4 = %d; nbpyrP4 = %d; nbquaQ4 = %d\n", NmbHexQ4, NmbPriP4, NmbPyrP4, NmbQuaQ4);
    }

    if ( OrdTetP4 >0 || OrdTriP4 > 0 || OrdEdgP4 > 0 || OrdHexQ4 > 0|| OrdPriP4 > 0 || OrdPyrP4 > 0|| OrdQuaQ4 > 0 ) {
      printf("P4/Q4 ordering :\n");
      if ( OrdTetP4 > 0 || OrdTriP4 > 0 || OrdEdgP4 > 0 ) {
        if ( OrdTetP4 > 0 )
          printf("tetP4 ");
        if ( OrdTriP4 > 0 )
          printf("triP4 ");
        if ( OrdEdgP4 > 0 )
          printf("edgP4 ");
        printf("\n");
      }
      if ( OrdHexQ4 > 0|| OrdPriP4 > 0 || OrdPyrP4 > 0|| OrdQuaQ4 > 0 ) {
        if ( OrdHexQ4 > 0 )
          printf("hexQ4 ");
        if ( OrdPriP4 > 0 )
          printf("priP4 ");
        if ( OrdPyrP4 > 0 )
          printf("pyrP4 ");
        if ( OrdQuaQ4 > 0 )
          printf("quaQ4 ");
        printf("\n");
      }
    }

    GmfCloseMesh(InpMsh);
     
  }
  

  // solution part

//-- test the reading of the file as a solution
  if (subsol != NULL) { //--- a file containing char ".sol" is given in input
    InpSol = GmfOpenMesh(sol, GmfRead, &FilVer, &dim);
    if ( InpSol == 0 ) {
      strcat(sol,"b");
      InpSol = GmfOpenMesh(sol, GmfRead, &FilVer, &dim);
    }
  }
  else { //-- check if a solution with the same name as the mesh one exists
    strcat(sol,".sol");
    InpSol = GmfOpenMesh(sol, GmfRead, &FilVer, &dim);
    if ( InpSol == 0 ) {
      strcat(sol,"b");
      InpSol = GmfOpenMesh(sol, GmfRead, &FilVer, &dim);
    }
  }

  if (InpSol!= 0 ) {
    printf("Solution informations :\n");
    if ( GmfStatKwd(InpSol, GmfTime) ) {
      GmfGotoKwd(InpSol, GmfTime);
      if ( FilVer == GmfFloat ) {	// read 32 bits float
       GmfGetLin(InpSol, GmfTime, &flt);
       time = (double)flt;
      }  
      else if ( FilVer == GmfDouble ) {	// read 64 bits float
        GmfGetLin(InpSol, GmfTime, &dbl);
        time = dbl;
      }
    }
    if ( GmfStatKwd(InpSol, GmfIterations) ) {
      GmfGotoKwd(InpSol, GmfIterations);
      GmfGetLin( InpSol, GmfIterations, &ite);  
    }  
    printf("dim = %d; ite = %d; time = %lg\n",dim, ite, time);
    for(i=1; i<=GmfMaxKwd; i++) {
      if( ( (!strcmp(GmfKwdFmt[i][2], "sr")  || !strcmp(GmfKwdFmt[i][2], "hr")) ) && ( (NbrLin = GmfStatKwd(InpSol, i, &NbrTyp, &SolSiz, TypTab, &deg, &NmbNod)) ) ) {
        printf("%s = %d\n", GmfKwdFmt[i][0], NbrLin);
        if ( deg != 1 && NmbNod != 0 )
          printf("deg = %d; nbnod = %d\n",deg, NmbNod);
        printf("type = [");
        for(j=0; j<NbrTyp; j++) {
          if (      TypTab[j] == 1 ) printf(" scalar ");
          else if ( TypTab[j] == 2 ) printf(" vector ");
          else if ( TypTab[j] == 3 ) printf(" metric ");
          else if ( TypTab[j] == 4 ) printf(" matrix ");
        }
        printf("]\n");
        deg = 1;
        NmbNod = 0;
      }
    }
    GmfCloseMesh(InpSol);
  }

  if ( InpSol == 0 && InpMsh == 0 ) {
    printf("cannot open mesh/solution file %s\n", argv[1]);
    exit(1);
  }

  return(0);

}